

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

char * __thiscall anon_unknown.dwarf_f2985::MMIFStream::readMemoryMapped(MMIFStream *this,int n)

{
  long lVar1;
  InputExc *pIVar2;
  int in_ESI;
  long in_RDI;
  char *retVal;
  
  if (*(ulong *)(in_RDI + 0x48) <= *(ulong *)(in_RDI + 0x40)) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar2,"Unexpected end of file.");
    __cxa_throw(pIVar2,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  if (*(ulong *)(in_RDI + 0x48) < (ulong)(*(long *)(in_RDI + 0x40) + (long)in_ESI)) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar2,"Reading past end of file.");
    __cxa_throw(pIVar2,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  lVar1 = *(long *)(in_RDI + 0x40);
  *(long *)(in_RDI + 0x40) = (long)in_ESI + *(long *)(in_RDI + 0x40);
  return (char *)(*(long *)(in_RDI + 0x38) + lVar1);
}

Assistant:

char*
MMIFStream::readMemoryMapped (int n)
{
    if (_pos >= _length)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    if (_pos + n > _length)
        throw IEX_NAMESPACE::InputExc ("Reading past end of file.");

    char* retVal = const_cast<char*>(_mmapStart) + _pos;
    _pos += n;
    return retVal;
}